

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O1

void __thiscall net_uv::KCPServer::executeOperation(KCPServer *this)

{
  Mutex *mutex;
  iterator *piVar1;
  _Rb_tree_header *p_Var2;
  void *pvVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  int iVar6;
  _Elt_pointer pSVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  SessionOperation *__args;
  iterator __position;
  bool bVar13;
  
  mutex = &(this->super_Server).super_SessionManager.m_operationMutex;
  iVar6 = uv_mutex_trylock(&mutex->m_uv_mutext);
  if (iVar6 == 0) {
    if ((this->super_Server).super_SessionManager.m_operationQue.c.
        super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->super_Server).super_SessionManager.m_operationQue.c.
        super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      uv_mutex_unlock(&mutex->m_uv_mutext);
      return;
    }
    __args = (this->super_Server).super_SessionManager.m_operationQue.c.
             super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->super_Server).super_SessionManager.m_operationQue.c.
        super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != __args) {
      do {
        pSVar7 = (this->super_Server).super_SessionManager.m_operationDispatchQue.c.
                 super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pSVar7 == (this->super_Server).super_SessionManager.m_operationDispatchQue.c.
                      super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::
          deque<net_uv::SessionManager::SessionOperation,std::allocator<net_uv::SessionManager::SessionOperation>>
          ::_M_push_back_aux<net_uv::SessionManager::SessionOperation_const&>
                    ((deque<net_uv::SessionManager::SessionOperation,std::allocator<net_uv::SessionManager::SessionOperation>>
                      *)&(this->super_Server).super_SessionManager.m_operationDispatchQue,__args);
        }
        else {
          uVar4 = __args->sessionID;
          pSVar7->operationDataLen = __args->operationDataLen;
          pSVar7->sessionID = uVar4;
          uVar5 = *(undefined4 *)&__args->field_0x4;
          pvVar3 = __args->operationData;
          pSVar7->operationType = __args->operationType;
          *(undefined4 *)&pSVar7->field_0x4 = uVar5;
          pSVar7->operationData = pvVar3;
          piVar1 = &(this->super_Server).super_SessionManager.m_operationDispatchQue.c.
                    super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        std::
        deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
        ::pop_front(&(this->super_Server).super_SessionManager.m_operationQue.c);
        __args = (this->super_Server).super_SessionManager.m_operationQue.c.
                 super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
      } while ((this->super_Server).super_SessionManager.m_operationQue.c.
               super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur != __args);
    }
    uv_mutex_unlock(&mutex->m_uv_mutext);
    pSVar7 = (this->super_Server).super_SessionManager.m_operationDispatchQue.c.
             super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->super_Server).super_SessionManager.m_operationDispatchQue.c.
        super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != pSVar7) {
      p_Var2 = &(this->m_allSession)._M_t._M_impl.super__Rb_tree_header;
      do {
        switch(pSVar7->operationType) {
        case 0:
          for (p_Var8 = (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var8 != p_Var2;
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
            if (*(char *)&p_Var8[1]._M_left == '\0') {
              (**(code **)(*(long *)p_Var8[1]._M_parent + 0x48))();
            }
          }
          (*(this->m_server->super_Socket)._vptr_Socket[7])();
          (this->super_Server).m_serverStage = WAIT_CLOSE_SERVER_SOCKET;
          Runnable::stopTimerUpdate((Runnable *)this);
          break;
        case 1:
          p_Var11 = (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var10 = &p_Var2->_M_header;
          if (p_Var11 != (_Base_ptr)0x0) {
            do {
              bVar13 = (uint)*(size_t *)(p_Var11 + 1) < pSVar7->sessionID;
              if (!bVar13) {
                p_Var10 = p_Var11;
              }
              p_Var11 = (&p_Var11->_M_left)[bVar13];
            } while (p_Var11 != (_Base_ptr)0x0);
          }
          p_Var12 = p_Var2;
          if (((_Rb_tree_header *)p_Var10 != p_Var2) &&
             (p_Var12 = (_Rb_tree_header *)p_Var10,
             pSVar7->sessionID < (uint)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
            p_Var12 = p_Var2;
          }
          if (p_Var12 == p_Var2) {
LAB_00143849:
            free(pSVar7->operationData);
          }
          else {
            (**(code **)(**(long **)(p_Var12 + 1) + 0x38))
                      (*(long **)(p_Var12 + 1),pSVar7->operationData,pSVar7->operationDataLen);
          }
          break;
        case 2:
          p_Var11 = (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var10 = &p_Var2->_M_header;
          if (p_Var11 != (_Base_ptr)0x0) {
            do {
              bVar13 = (uint)*(size_t *)(p_Var11 + 1) < pSVar7->sessionID;
              if (!bVar13) {
                p_Var10 = p_Var11;
              }
              p_Var11 = (&p_Var11->_M_left)[bVar13];
            } while (p_Var11 != (_Base_ptr)0x0);
          }
          p_Var12 = p_Var2;
          if (((_Rb_tree_header *)p_Var10 != p_Var2) &&
             (p_Var12 = (_Rb_tree_header *)p_Var10,
             pSVar7->sessionID < (uint)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
            p_Var12 = p_Var2;
          }
          if (p_Var12 == p_Var2) goto LAB_00143849;
          (**(code **)(**(long **)(p_Var12 + 1) + 0x40))
                    (*(long **)(p_Var12 + 1),pSVar7->operationData,pSVar7->operationDataLen);
          break;
        case 3:
          p_Var11 = (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var10 = &p_Var2->_M_header;
          if (p_Var11 != (_Base_ptr)0x0) {
            do {
              bVar13 = (uint)*(size_t *)(p_Var11 + 1) < pSVar7->sessionID;
              if (!bVar13) {
                p_Var10 = p_Var11;
              }
              p_Var11 = (&p_Var11->_M_left)[bVar13];
            } while (p_Var11 != (_Base_ptr)0x0);
          }
          p_Var12 = p_Var2;
          if (((_Rb_tree_header *)p_Var10 != p_Var2) &&
             (p_Var12 = (_Rb_tree_header *)p_Var10,
             pSVar7->sessionID < (uint)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
            p_Var12 = p_Var2;
          }
          if (p_Var12 != p_Var2) {
            (**(code **)(**(long **)(p_Var12 + 1) + 0x48))();
          }
          break;
        case 4:
          p_Var11 = (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var9 = &p_Var2->_M_header;
          if (p_Var11 != (_Base_ptr)0x0) {
            do {
              bVar13 = (uint)*(size_t *)(p_Var11 + 1) < pSVar7->sessionID;
              if (!bVar13) {
                p_Var9 = p_Var11;
              }
              p_Var11 = (&p_Var11->_M_left)[bVar13];
            } while (p_Var11 != (_Base_ptr)0x0);
          }
          __position._M_node = &p_Var2->_M_header;
          if (((_Rb_tree_header *)p_Var9 != p_Var2) &&
             (__position._M_node = p_Var9, pSVar7->sessionID < p_Var9[1]._M_color)) {
            __position._M_node = &p_Var2->_M_header;
          }
          if ((_Rb_tree_header *)__position._M_node != p_Var2) {
            (*(code *)**(undefined8 **)__position._M_node[1]._M_parent)();
            free(__position._M_node[1]._M_parent);
            std::
            _Rb_tree<unsigned_int,std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>,std::_Select1st<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>>
            ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>,std::_Select1st<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>>
                                *)&this->m_allSession,__position);
          }
        }
        std::
        deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
        ::pop_front(&(this->super_Server).super_SessionManager.m_operationDispatchQue.c);
        pSVar7 = (this->super_Server).super_SessionManager.m_operationDispatchQue.c.
                 super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
      } while ((this->super_Server).super_SessionManager.m_operationDispatchQue.c.
               super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur != pSVar7);
    }
  }
  return;
}

Assistant:

void KCPServer::executeOperation()
{
	if (m_operationMutex.trylock() != 0)
	{
		return;
	}

	if (m_operationQue.empty())
	{
		m_operationMutex.unlock();
		return;
	}

	while (!m_operationQue.empty())
	{
		m_operationDispatchQue.push(m_operationQue.front());
		m_operationQue.pop();
	}
	m_operationMutex.unlock();

	while (!m_operationDispatchQue.empty())
	{
		auto & curOperation = m_operationDispatchQue.front();
		switch (curOperation.operationType)
		{
		case KCP_SVR_OP_SEND_DATA:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->executeSend((char*)curOperation.operationData, curOperation.operationDataLen);
			}
			else
			{
				//invalid session
				fc_free(curOperation.operationData);
			}
		}break;
		case KCP_SVR_OP_SEND_CLOSE:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->executeSendAndClose((char*)curOperation.operationData, curOperation.operationDataLen);
			}
			else
			{
				//invalid session
				fc_free(curOperation.operationData);
			}
		}break;
		case KCP_SVR_OP_DIS_SESSION:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->executeDisconnect();
			}
		}break;
		case KCP_SVR_OP_SEND_DIS_SESSION_MSG_TO_MAIN_THREAD:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->~KCPSession();
				fc_free(it->second.session);
				it = m_allSession.erase(it);
			}
		}break;
		case KCP_SVR_OP_STOP_SERVER:
		{
			for (auto & it : m_allSession)
			{
				if (!it.second.isInvalid)
				{
					it.second.session->executeDisconnect();
				}
			}
			m_server->disconnect();
			m_serverStage = ServerStage::WAIT_CLOSE_SERVER_SOCKET;

			stopTimerUpdate();
		}break;
		default:
			break;
		}
		m_operationDispatchQue.pop();
	}
}